

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboCompletenessTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles2::Functional::SupportedCombinationTest::tryCombination
          (SupportedCombinationTest *this,FormatCombination *comb)

{
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  ObjectTraits *traits;
  Functions *pFVar3;
  Framebuffer fbo;
  FboBuilder builder;
  ObjectWrapper local_110;
  FboBuilder local_f8;
  
  iVar1 = (*((this->super_TestBase).m_ctx)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_110,(Functions *)CONCAT44(extraout_var,iVar1),traits);
  pFVar3 = deqp::gls::fboc::details::gl(&this->super_TestBase);
  deqp::gls::FboUtil::FboBuilder::FboBuilder(&local_f8,local_110.m_object,0x8d40,pFVar3);
  deqp::gls::fboc::details::TestBase::attachTargetToNew
            (&this->super_TestBase,0x8ce0,comb->colorKind,comb->colorFmt,0x40,0x40,&local_f8);
  deqp::gls::fboc::details::TestBase::attachTargetToNew
            (&this->super_TestBase,0x8d00,comb->depthKind,comb->depthFmt,0x40,0x40,&local_f8);
  deqp::gls::fboc::details::TestBase::attachTargetToNew
            (&this->super_TestBase,0x8d20,comb->stencilKind,comb->stencilFmt,0x40,0x40,&local_f8);
  pFVar3 = deqp::gls::fboc::details::gl(&this->super_TestBase);
  GVar2 = (*pFVar3->checkFramebufferStatus)(0x8d40);
  deqp::gls::FboUtil::FboBuilder::~FboBuilder(&local_f8);
  glu::ObjectWrapper::~ObjectWrapper(&local_110);
  return GVar2 == 0x8cd5;
}

Assistant:

bool SupportedCombinationTest::tryCombination (const FormatCombination& comb)
{
	glu::Framebuffer fbo(m_ctx.getRenderContext());
	FboBuilder builder(*fbo, GL_FRAMEBUFFER, fboc::gl(*this));

	attachTargetToNew(GL_COLOR_ATTACHMENT0,		comb.colorKind,		comb.colorFmt,
					  64,						64,					builder);
	attachTargetToNew(GL_DEPTH_ATTACHMENT,		comb.depthKind,		comb.depthFmt,
					  64,						64,					builder);
	attachTargetToNew(GL_STENCIL_ATTACHMENT,	comb.stencilKind,	comb.stencilFmt,
					  64,						64,					builder);

	const GLenum glStatus = fboc::gl(*this).checkFramebufferStatus(GL_FRAMEBUFFER);

	return (glStatus == GL_FRAMEBUFFER_COMPLETE);
}